

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseSession.cpp
# Opt level: O0

Result __thiscall
tonk::ApplicationSession::tonk_connect
          (ApplicationSession *this,TonkConnectionConfig config,char *serverHostname,
          uint16_t serverPort,TonkConnection *connectionOut)

{
  long *plVar1;
  char *pcVar2;
  long in_RSI;
  ErrorResult *in_RDI;
  undefined8 *in_R8;
  char *in_stack_00000060;
  TonkConnectionConfig *in_stack_00000068;
  TonkSocketConfig *in_stack_00000070;
  Dependencies *in_stack_00000078;
  Connection *in_stack_00000080;
  Connection *connection;
  Result *result;
  uint16_t in_stack_00000660;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  TonkConnectionConfig *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  ErrorType type;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  char *in_stack_fffffffffffffe38;
  ErrorResult *in_stack_fffffffffffffe40;
  Connection *in_stack_fffffffffffffe68;
  allocator *paVar3;
  long *local_168;
  char *local_f0;
  allocator local_e1;
  string local_e0 [32];
  undefined8 local_c0 [3];
  undefined1 local_a1;
  long *local_a0;
  undefined1 local_91;
  undefined8 *local_90;
  long *local_60;
  undefined8 *local_50;
  undefined8 local_28;
  undefined4 local_1c;
  string *local_18;
  char *local_10;
  undefined8 *local_8;
  
  type = (ErrorType)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_90 = in_R8;
  MakeCallbacksOptional(in_stack_fffffffffffffe20);
  local_91 = 0;
  in_RDI->Source = (char *)0x0;
  plVar1 = (long *)operator_new(0xc930,(nothrow_t *)&std::nothrow);
  local_a1 = 0;
  local_168 = (long *)0x0;
  if (plVar1 != (long *)0x0) {
    local_a1 = 1;
    Connection::Connection(in_stack_fffffffffffffe68);
    local_168 = plVar1;
  }
  local_a0 = local_168;
  *local_90 = local_168;
  if (local_168 == (long *)0x0) {
    paVar3 = &local_e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"Out of memory",paVar3);
    local_8 = local_c0;
    local_10 = "ApplicationSession::tonk_connect";
    local_18 = local_e0;
    local_1c = 0;
    local_28 = 2;
    pcVar2 = (char *)operator_new(0x38);
    ErrorResult::ErrorResult
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
               (string *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),type,
               (ErrorCodeT)in_stack_fffffffffffffe20);
    local_50 = local_c0;
    in_RDI->Source = pcVar2;
    local_c0[0] = 0;
    Result::~Result((Result *)in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  }
  else {
    std::__shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<tonk::gateway::MappedPortLifetime,_(__gnu_cxx::_Lock_policy)2> *)
               (in_RSI + 0x3ab8));
    std::shared_ptr<asio::io_context>::shared_ptr
              ((shared_ptr<asio::io_context> *)in_stack_fffffffffffffe20,
               (shared_ptr<asio::io_context> *)
               CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    asio::ip::basic_endpoint<asio::ip::udp>::basic_endpoint
              ((basic_endpoint<asio::ip::udp> *)0x1ebcde);
    Connection::InitializeOutgoingConnection
              (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000060,in_stack_00000660);
    local_60 = (long *)&local_f0;
    in_RDI->Source = local_f0;
    local_f0 = (char *)0x0;
    Result::~Result((Result *)in_stack_fffffffffffffe20);
    Connection::Dependencies::~Dependencies((Dependencies *)0x1ebd86);
  }
  if (in_RDI->Source != (char *)0x0) {
    if (local_a0 != (long *)0x0) {
      (**(code **)(*local_a0 + 8))();
    }
    *local_90 = 0;
  }
  return (Result)in_RDI;
}

Assistant:

Result ApplicationSession::tonk_connect(
    TonkConnectionConfig config,
    const char* serverHostname,
    uint16_t serverPort,
    TonkConnection* connectionOut)
{
    MakeCallbacksOptional(config);

    Result result;

    Connection* connection = new (std::nothrow) Connection;
    *connectionOut = reinterpret_cast<TonkConnection>(connection);

    if (!connection)
        result = Result("ApplicationSession::tonk_connect", "Out of memory", ErrorType::Tonk);
    else
    {
        result = connection->InitializeOutgoingConnection({
            &SelfRefCount,
            &MainSocket,
            &MainSocket.AddressMap,
            &IdMap,
            &P2PKeyMap,
            MappedPort.get(),
            Context,
            nullptr, // No FloodDetector backref for outgoing connections
            UDPAddress(), // No Disconnect addr key
            this
        },
            &Config,
            config,
            serverHostname,
            serverPort);
    }

    if (result.IsFail())
    {
        delete connection;
        *connectionOut = nullptr;
    }

    return result;
}